

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_insertADynArray_success_negativeIndexGetsMaxIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte *array;
  char *pcVar4;
  char *expr;
  void *_ck_x;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  char *local_30;
  char *local_28;
  byte *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = (char *)0x5;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = (char *)0x8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_20 = (byte *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  local_20[0] = 0x30;
  local_20[1] = 0x31;
  local_20[2] = 0x32;
  local_20[3] = 0x33;
  local_20[4] = 0x34;
  array = (byte *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  array[2] = 0;
  array[0] = 0x35;
  array[1] = 0x36;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_insertArray(&local_48,0xffffffffffffffff,array,3,1);
  if (bVar1 == true) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x494);
    if (local_30 == (char *)0x8) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x495);
      if (local_28 == (char *)0x8) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x496);
        if (local_20 == (byte *)0x0) {
          pcVar8 = (char *)0x0;
          pcVar7 = (char *)0x0;
          expr = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar5 = "(void*) destArray.buffer != NULL";
          pcVar6 = "(void*) destArray.buffer";
          iVar2 = 0x497;
        }
        else {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x497);
          pcVar7 = (char *)local_20;
          if (local_20 == (byte *)0x0) {
            pcVar8 = "";
            pcVar7 = "(null)";
          }
          else {
            iVar2 = strcmp("0123456",(char *)local_20);
            if (iVar2 == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x498);
              if (local_38 == (code *)0x0) {
                pcVar8 = (char *)0x0;
                pcVar7 = (char *)0x0;
                expr = "Assertion \'_ck_x != NULL\' failed";
                pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                pcVar5 = "(void*) destArray.growStrategy != NULL";
                pcVar6 = "(void*) destArray.growStrategy";
                iVar2 = 0x499;
              }
              else {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x499);
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x49a);
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x49b);
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x49c);
                uVar3 = *array - 0x35;
                if ((uVar3 == 0) && (uVar3 = array[1] - 0x36, uVar3 == 0)) {
                  uVar3 = (uint)array[2];
                }
                if (uVar3 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                              ,0x49d);
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                              ,0x49e);
                  if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                ,0x49f);
                    (*pcStack_40)(local_20);
                    private_ACUtilsTest_ADynArray_free(array);
                    return;
                  }
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
                  pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
                  iVar2 = 0x49f;
                  pcVar8 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
                  pcVar7 = (char *)(byte *)0x15f858;
                }
                else {
                  pcVar8 = "\"";
                  expr = 
                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                  ;
                  pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                  pcVar5 = "srcArray.buffer == \"56\"";
                  pcVar6 = "srcArray.buffer";
                  iVar2 = 0x49d;
                  pcVar7 = (char *)array;
                }
              }
              goto LAB_00113db8;
            }
            pcVar8 = "\"";
          }
          expr = 
          "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
          ;
          pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
          pcVar5 = "destArray.buffer == \"0123456\"";
          pcVar6 = "destArray.buffer";
          iVar2 = 0x498;
        }
      }
      else {
        pcVar7 = "8";
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar5 = "destArray.capacity == 8";
        pcVar6 = "destArray.capacity";
        iVar2 = 0x496;
        pcVar8 = local_28;
      }
    }
    else {
      pcVar7 = "8";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "destArray.size == 8";
      pcVar6 = "destArray.size";
      iVar2 = 0x495;
      pcVar8 = local_30;
    }
  }
  else {
    pcVar8 = (char *)(ulong)bVar1;
    pcVar7 = "true";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, -1, (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer))) == true"
    ;
    pcVar6 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, -1, (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer)))"
    ;
    iVar2 = 0x494;
  }
LAB_00113db8:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar4,pcVar5,pcVar6,pcVar8,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insertADynArray_success_negativeIndexGetsMaxIndex)
{
    struct private_ACUtilsTest_ADynArray_CharArray destArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray srcArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    destArray.size = 5;
    destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    destArray.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    destArray.buffer = (char*) destArray.reallocator(nullptr, destArray.capacity);
    memcpy(destArray.buffer, "01234", 5);
    srcArray.size = 3;
    srcArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    srcArray.capacity = 8;
    srcArray.buffer = (char*) srcArray.reallocator(nullptr, srcArray.capacity);
    memcpy(srcArray.buffer, "56", 3);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insertADynArray(&destArray, -1, &srcArray), true);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(destArray.buffer, "0123456");
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.size, 3);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(srcArray.buffer, "56");
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    destArray.deallocator(destArray.buffer);
    srcArray.deallocator(srcArray.buffer);
}